

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsConvert::flushExternal(SmodelsConvert *this)

{
  bool bVar1;
  uint uVar2;
  Atom_t AVar3;
  long in_RDI;
  Atom_t at;
  Value_t vt;
  Atom *a;
  const_iterator end;
  const_iterator it;
  LitSpan T;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *c;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  SmData *this_00;
  Span<unsigned_int> local_78;
  Head_t local_68;
  E local_64;
  Span<unsigned_int> local_60;
  Head_t local_4c;
  Atom_t local_48;
  Value_t local_44;
  Atom *local_40;
  uint *local_38;
  uint *local_28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  Span<int> local_18;
  
  local_18 = toSpan<int>();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11d446);
  local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffff58);
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff60,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    this_00 = *(SmData **)(in_RDI + 0x10);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator*(&local_20);
    local_40 = SmData::mapAtom(this_00,(Atom_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    Value_t::Value_t(&local_44,(uint)*local_40 >> 0x1e);
    if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
      if (((uint)*local_40 >> 0x1c & 1) == 0) {
        local_48 = SmData::Atom::operator_cast_to_unsigned_int(local_40);
        uVar2 = Value_t::operator_cast_to_unsigned_int(&local_44);
        if (uVar2 == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
        else {
          uVar2 = Value_t::operator_cast_to_unsigned_int(&local_44);
          if (uVar2 == 1) {
            in_stack_ffffffffffffff70 =
                 *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 8);
            Head_t::Head_t(&local_4c,Disjunctive);
            local_60 = toSpan<unsigned_int>(&local_48,1);
            (**(code **)((in_stack_ffffffffffffff70->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 8))
                      (in_stack_ffffffffffffff70,local_4c.val_,&local_60,&local_18);
          }
        }
      }
    }
    else {
      in_stack_ffffffffffffff68 = *(value_type_conflict1 **)(in_RDI + 8);
      AVar3 = SmData::Atom::operator_cast_to_unsigned_int(local_40);
      local_64 = local_44.val_;
      (**(code **)(*(long *)in_stack_ffffffffffffff68 + 0x48))
                (in_stack_ffffffffffffff68,AVar3,local_44.val_);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_20);
  }
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(in_stack_ffffffffffffff70)
  ;
  if (!bVar1) {
    c = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 8);
    Head_t::Head_t(&local_68,Choice);
    local_78 = toSpan<std::vector<unsigned_int,std::allocator<unsigned_int>>>(c);
    (**(code **)((c->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start + 8))(c,local_68.val_,&local_78,&local_18);
  }
  return;
}

Assistant:

void SmodelsConvert::flushExternal() {
	LitSpan T = toSpan<Lit_t>();
	data_->head_.clear();
	for (SmData::AtomVec::const_iterator it = data_->extern_.begin(), end = data_->extern_.end(); it != end; ++it) {
		SmData::Atom& a = data_->mapAtom(*it);
		Value_t vt = static_cast<Value_t>(a.extn);
		if (!ext_) {
			if (a.head) { continue; }
			Atom_t at = a;
			if      (vt == Value_t::Free) { data_->head_.push_back(at); }
			else if (vt == Value_t::True) { out_.rule(Head_t::Disjunctive, toSpan(&at, 1), T); }
		}
		else {
			out_.external(a, vt);
		}
	}
	if (!data_->head_.empty()) {
		out_.rule(Head_t::Choice, toSpan(data_->head_), T);
	}
}